

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::StructConstant,spvtools::opt::analysis::Struct_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
          (spvtools *this,Struct **args,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *args_1)

{
  StructConstant *this_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *args_local_1;
  Struct **args_local;
  
  this_00 = (StructConstant *)operator_new(0x28);
  opt::analysis::StructConstant::StructConstant(this_00,*args,args_1);
  std::
  unique_ptr<spvtools::opt::analysis::StructConstant,std::default_delete<spvtools::opt::analysis::StructConstant>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::StructConstant>,void>
            ((unique_ptr<spvtools::opt::analysis::StructConstant,std::default_delete<spvtools::opt::analysis::StructConstant>>
              *)this,this_00);
  return (__uniq_ptr_data<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}